

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

Arena * tcmalloc::LowLevelAlloc::DefaultArena(void)

{
  if (DefaultArena::arena == (Arena *)0x0) {
    DefaultArena::arena =
         StaticStorage<tcmalloc::LowLevelAlloc::Arena>::Construct<>
                   ((StaticStorage<tcmalloc::LowLevelAlloc::Arena> *)default_arena_storage);
  }
  return DefaultArena::arena;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::DefaultArena() {
  static Arena* arena;
  if (!arena) {
    // Note, we expect this to happen early enough in process
    // lifetime, so we can afford to do without memory barriers.
    arena = default_arena_storage.Construct();
  }
  return arena;
}